

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

ON_Arc * __thiscall
ON_RevSurface::IsoArc(ON_Arc *__return_storage_ptr__,ON_RevSurface *this,double curve_parameter)

{
  ON_Curve *this_00;
  double t;
  bool bVar1;
  ON_3dVector local_190;
  ON_3dVector local_178;
  undefined1 local_160 [8];
  ON_3dPoint Q;
  ON_3dPoint local_138;
  ON_3dVector local_120;
  ON_3dVector local_108;
  ON_3dPoint local_f0;
  int local_d8;
  undefined1 auStack_c8 [8];
  ON_3dPoint P;
  undefined1 auStack_a8 [8];
  ON_Circle circle;
  double curve_parameter_local;
  ON_RevSurface *this_local;
  ON_Arc *arc;
  
  circle.radius = curve_parameter;
  if (this->m_curve != (ON_Curve *)0x0) {
    ON_Circle::ON_Circle((ON_Circle *)auStack_a8);
    ON_Curve::PointAt((ON_3dPoint *)auStack_c8,this->m_curve,circle.radius);
    bVar1 = ON_3dPoint::IsValid((ON_3dPoint *)auStack_c8);
    if (bVar1) {
      ON_Line::ClosestPointTo(&local_f0,&this->m_axis,(ON_3dPoint *)auStack_c8);
      circle.plane.origin.y = local_f0.z;
      auStack_a8 = (undefined1  [8])local_f0.x;
      circle.plane.origin.x = local_f0.y;
      ON_Line::Tangent(&local_108,&this->m_axis);
      circle.plane.zaxis.y = local_108.z;
      circle.plane.yaxis.z = local_108.x;
      circle.plane.zaxis.x = local_108.y;
      ON_3dPoint::operator-(&local_120,(ON_3dPoint *)auStack_c8,(ON_3dPoint *)auStack_a8);
      circle.plane.xaxis.y = local_120.z;
      circle.plane.origin.z = local_120.x;
      circle.plane.xaxis.x = local_120.y;
      circle.plane.plane_equation.d = ON_3dVector::Length((ON_3dVector *)&circle.plane.origin.z);
      bVar1 = ON_3dVector::Unitize((ON_3dVector *)&circle.plane.origin.z);
      if (!bVar1) {
        this_00 = this->m_curve;
        (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
        t = ON_Interval::ParameterAt((ON_Interval *)&Q.z,0.5);
        ON_Curve::PointAt(&local_138,this_00,t);
        P.y = local_138.z;
        auStack_c8 = (undefined1  [8])local_138.x;
        P.x = local_138.y;
        ON_Line::ClosestPointTo((ON_3dPoint *)local_160,&this->m_axis,(ON_3dPoint *)auStack_c8);
        ON_3dPoint::operator-(&local_178,(ON_3dPoint *)auStack_c8,(ON_3dPoint *)local_160);
        circle.plane.xaxis.y = local_178.z;
        circle.plane.origin.z = local_178.x;
        circle.plane.xaxis.x = local_178.y;
        bVar1 = ON_3dVector::Unitize((ON_3dVector *)&circle.plane.origin.z);
        if (!bVar1) {
          ON_3dVector::PerpendicularTo
                    ((ON_3dVector *)&circle.plane.origin.z,(ON_3dVector *)&circle.plane.yaxis.z);
        }
      }
      ON_CrossProduct(&local_190,(ON_3dVector *)&circle.plane.yaxis.z,
                      (ON_3dVector *)&circle.plane.origin.z);
      circle.plane.yaxis.y = local_190.z;
      circle.plane.xaxis.z = local_190.x;
      circle.plane.yaxis.x = local_190.y;
      ON_3dVector::Unitize((ON_3dVector *)&circle.plane.xaxis.z);
      ON_Plane::UpdateEquation((ON_Plane *)auStack_a8);
      ON_Arc::ON_Arc(__return_storage_ptr__,(ON_Circle *)auStack_a8,
                     (ON_Interval)*&(this->m_angle).m_t);
      local_d8 = 1;
    }
    else {
      local_d8 = 2;
    }
    ON_Circle::~ON_Circle((ON_Circle *)auStack_a8);
    if (local_d8 == 1) {
      return __return_storage_ptr__;
    }
  }
  ON_Arc::ON_Arc(__return_storage_ptr__);
  memcpy(__return_storage_ptr__,&ON_Plane::NanPlane,0x80);
  (__return_storage_ptr__->super_ON_Circle).radius = ON_DBL_QNAN;
  return __return_storage_ptr__;
}

Assistant:

ON_Arc ON_RevSurface::IsoArc(
  double curve_parameter
) const
{
  for (;;)
  {
    if (nullptr == m_curve)
      break;
    // 8 December 2003 Chuck - fix iso extraction bug
    //   when m_angle[0] != 0.
    ON_Circle circle;
    ON_3dPoint P = m_curve->PointAt(curve_parameter);
    if (false == P.IsValid())
      break;
    circle.plane.origin = m_axis.ClosestPointTo(P);
    circle.plane.zaxis = m_axis.Tangent();
    circle.plane.xaxis = P - circle.plane.origin;
    circle.radius = circle.plane.xaxis.Length();
    if (!circle.plane.xaxis.Unitize())
    {
      // 8 December 2003 Dale Lear - get valid zero radius
      //   arc/circle when revolute hits the axis.
      // First: try middle of revolute for x-axis
      P = m_curve->PointAt(m_curve->Domain().ParameterAt(0.5));
      ON_3dPoint Q = m_axis.ClosestPointTo(P);
      circle.plane.xaxis = P - Q;
      if (!circle.plane.xaxis.Unitize())
      {
        // Then: just use a vector perp to zaxis
        circle.plane.xaxis.PerpendicularTo(circle.plane.zaxis);
      }
    }
    circle.plane.yaxis = ON_CrossProduct(circle.plane.zaxis, circle.plane.xaxis);
    circle.plane.yaxis.Unitize();
    circle.plane.UpdateEquation();
    ON_Arc arc(circle, m_angle);
    return arc;
  }
  ON_Arc arc;
  arc.plane = ON_Plane::NanPlane;
  arc.radius = ON_DBL_QNAN;
  return arc;
}